

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSwap.cpp
# Opt level: O0

void __thiscall NaPNSwapper::action(NaPNSwapper *this)

{
  bool bVar1;
  int iVar2;
  NaVector *pNVar3;
  undefined4 extraout_var;
  NaVector *pNVar4;
  long in_RDI;
  NaPetriCnOutput *in_stack_ffffffffffffffc8;
  NaPetriCnInput *in_stack_ffffffffffffffd8;
  
  pNVar3 = NaPetriCnInput::data(in_stack_ffffffffffffffd8);
  iVar2 = (*pNVar3->_vptr_NaVector[8])(pNVar3,0);
  if (*(double *)CONCAT44(extraout_var,iVar2) <= 0.0) {
    bVar1 = NaPetriCnInput::is_waiting((NaPetriCnInput *)in_stack_ffffffffffffffc8);
    if ((!bVar1) && (bVar1 = NaPetriCnOutput::is_waiting(in_stack_ffffffffffffffc8), !bVar1)) {
      in_stack_ffffffffffffffd8 = (NaPetriCnInput *)NaPetriCnInput::data(in_stack_ffffffffffffffd8);
      pNVar3 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0x120));
      (*pNVar3->_vptr_NaVector[2])(pNVar3,in_stack_ffffffffffffffd8);
    }
    bVar1 = NaPetriCnInput::is_waiting((NaPetriCnInput *)in_stack_ffffffffffffffc8);
    if ((!bVar1) && (bVar1 = NaPetriCnOutput::is_waiting(in_stack_ffffffffffffffc8), !bVar1)) {
      pNVar3 = NaPetriCnInput::data(in_stack_ffffffffffffffd8);
      pNVar4 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0x1a0));
      (*pNVar4->_vptr_NaVector[2])(pNVar4,pNVar3);
    }
  }
  else {
    bVar1 = NaPetriCnInput::is_waiting((NaPetriCnInput *)in_stack_ffffffffffffffc8);
    if ((!bVar1) && (bVar1 = NaPetriCnOutput::is_waiting(in_stack_ffffffffffffffc8), !bVar1)) {
      pNVar3 = NaPetriCnInput::data(in_stack_ffffffffffffffd8);
      pNVar4 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0x120));
      (*pNVar4->_vptr_NaVector[2])(pNVar4,pNVar3);
    }
    bVar1 = NaPetriCnInput::is_waiting((NaPetriCnInput *)in_stack_ffffffffffffffc8);
    if ((!bVar1) && (bVar1 = NaPetriCnOutput::is_waiting(in_stack_ffffffffffffffc8), !bVar1)) {
      pNVar3 = NaPetriCnInput::data(in_stack_ffffffffffffffd8);
      pNVar4 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0x1a0));
      (*pNVar4->_vptr_NaVector[2])(pNVar4,pNVar3);
    }
  }
  return;
}

Assistant:

void
NaPNSwapper::action ()
{
    if(turn.data()[0] > 0){
        // Copy input to output
        if(!in.is_waiting() && !out.is_waiting()){
            out.data() = in.data();
        }
        if(!in2.is_waiting() && !out2.is_waiting()){
            out2.data() = in2.data();
        }
    }else{
        // Copy crossed input to output
        if(!in2.is_waiting() && !out.is_waiting()){
            out.data() = in2.data();
        }
        if(!in.is_waiting() && !out2.is_waiting()){
            out2.data() = in.data();
        }
    }
}